

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O0

unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_> *
__thiscall ReachableNets::All(ReachableNets *this)

{
  long lVar1;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *pszFile;
  char *in_stack_ffffffffffffffc8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffd0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  this_00 = in_RSI;
  AssertLockNotHeldInline("m_mutex",(char *)in_RDI,in_stack_ffffffffffffff9c,(Mutex *)0x239889);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(char *)pszFile,
             (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  std::unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  ::unordered_set((unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)0x2398c6);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        AssertLockNotHeld(m_mutex);
        LOCK(m_mutex);
        return m_reachable;
    }